

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

Routine * env_routine_get(Routine *__return_storage_ptr__,char *identifer,int line,Environment *env)

{
  Instance *pIVar1;
  anon_union_8_4_50a03f35_for_Literal_2 aVar2;
  undefined8 uVar3;
  char **ppcVar4;
  undefined8 uVar5;
  int iVar6;
  Record *pRVar7;
  char *__format;
  
  pRVar7 = env_match(identifer,env);
  if (pRVar7 == (Record *)0x0) {
    iVar6 = strcmp(identifer,"Main");
    if (iVar6 != 0) {
      __format = "\x1b[31m\n[Runtime Error] [Line:%d] Routine %s is not defined!\x1b[0m";
      goto LAB_00106988;
    }
    printf("\x1b[31m\n[Error] Unable to start! Routine Main is not defined!\x1b[0m");
  }
  else {
    if ((pRVar7->object).type == OBJECT_ROUTINE) goto LAB_001069ab;
    __format = "\x1b[31m\n[Runtime Error] [Line:%d] %s is not a callable routine!\x1b[0m";
LAB_00106988:
    printf(__format,(ulong)(uint)line,identifer);
  }
  stop();
LAB_001069ab:
  (__return_storage_ptr__->code).statements =
       *(Statement **)((long)&(pRVar7->object).field_1 + 0x30);
  pIVar1 = (pRVar7->object).field_1.instance;
  aVar2 = (pRVar7->object).field_1.literal.field_2;
  uVar3 = *(undefined8 *)((long)&(pRVar7->object).field_1 + 0x10);
  ppcVar4 = (pRVar7->object).field_1.routine.arguments;
  uVar5 = *(undefined8 *)((long)&(pRVar7->object).field_1 + 0x28);
  *(undefined8 *)&__return_storage_ptr__->isNative =
       *(undefined8 *)((long)&(pRVar7->object).field_1 + 0x20);
  (__return_storage_ptr__->code).numStatements = (int)uVar5;
  (__return_storage_ptr__->code).blockName = (int)((ulong)uVar5 >> 0x20);
  *(undefined8 *)&__return_storage_ptr__->arity = uVar3;
  __return_storage_ptr__->arguments = ppcVar4;
  *(Instance **)__return_storage_ptr__ = pIVar1;
  __return_storage_ptr__->name = (char *)aVar2;
  return __return_storage_ptr__;
}

Assistant:

Routine env_routine_get(char *identifer, int line, Environment *env){
    Record *match = env_match(identifer, env);
    if(match == NULL){
        if(strcmp(identifer, "Main") == 0){
            printf(error("Unable to start! Routine Main is not defined!"));
        }
        else
            printf(runtime_error("Routine %s is not defined!"), line, identifer);
        stop();
    }
    else if(match->object.type != OBJECT_ROUTINE){
        printf(runtime_error("%s is not a callable routine!"), line, identifer);
        stop();
    }
    return match->object.routine;
}